

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  ImTextureID pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  ImDrawCmd *pIVar13;
  int iVar14;
  undefined1 in_ZMM1 [64];
  
  pIVar11 = (this->CmdBuffer).Data;
  iVar10 = (this->CmdBuffer).Size;
  pIVar13 = pIVar11 + (long)iVar10 + -1;
  if ((pIVar11[(long)iVar10 + -1].ElemCount != 0) &&
     (pIVar13->ClipRect != (this->_CmdHeader).ClipRect)) {
    IVar1 = (this->_CmdHeader).ClipRect;
    auVar5 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x20);
    auVar5 = vcmpps_avx((undefined1  [16])IVar1,auVar5,2);
    auVar6 = vshufps_avx(auVar5,auVar5,0x50);
    auVar5 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    if (((auVar5 & ~auVar6) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar5 & ~auVar6,0xf)) {
      pvVar4 = (this->_CmdHeader).TextureId;
      uVar2 = (this->_CmdHeader).VtxOffset;
      uVar3 = (this->IdxBuffer).Size;
      iVar10 = (this->CmdBuffer).Size;
      if (iVar10 == (this->CmdBuffer).Capacity) {
        if (iVar10 == 0) {
          iVar12 = 8;
        }
        else {
          iVar12 = iVar10 / 2 + iVar10;
        }
        iVar14 = iVar10 + 1;
        if (iVar10 + 1 < iVar12) {
          iVar14 = iVar12;
        }
        pIVar11 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar14 * 0x38);
        pIVar13 = (this->CmdBuffer).Data;
        if (pIVar13 != (ImDrawCmd *)0x0) {
          memcpy(pIVar11,pIVar13,(long)(this->CmdBuffer).Size * 0x38);
          ImGui::MemFree((this->CmdBuffer).Data);
        }
        (this->CmdBuffer).Data = pIVar11;
        (this->CmdBuffer).Capacity = iVar14;
        iVar10 = (this->CmdBuffer).Size;
      }
      else {
        pIVar11 = (this->CmdBuffer).Data;
      }
      pIVar11[iVar10].ClipRect = IVar1;
      pIVar11[iVar10].TextureId = pvVar4;
      pIVar11[iVar10].VtxOffset = uVar2;
      pIVar11[iVar10].IdxOffset = uVar3;
      *(undefined8 *)&pIVar11[iVar10].ElemCount = 0;
      *(ImDrawCallback *)(&pIVar11[iVar10].ElemCount + 2) = (ImDrawCallback)0x0;
      pIVar11[iVar10].UserCallbackData = (void *)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar11[(long)iVar10 + -1].UserCallback != (ImDrawCallback)0x0) {
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1ef,"void ImDrawList::_OnChangedClipRect()");
  }
  if ((((1 < iVar10) && (pIVar11[(long)iVar10 + -1].ElemCount == 0)) &&
      (auVar5 = vpor_avx((undefined1  [16])(this->_CmdHeader).ClipRect ^
                         (undefined1  [16])pIVar11[(long)iVar10 + -2].ClipRect,
                         *(undefined1 (*) [16])&(this->_CmdHeader).ClipRect.w ^
                         *(undefined1 (*) [16])&pIVar11[(long)iVar10 + -2].ClipRect.w),
      auVar5 == (undefined1  [16])0x0)) &&
     (pIVar11[(long)iVar10 + -2].UserCallback == (ImDrawCallback)0x0)) {
    (this->CmdBuffer).Size = iVar10 + -1;
    return;
  }
  fVar7 = (this->_CmdHeader).ClipRect.y;
  fVar8 = (this->_CmdHeader).ClipRect.z;
  fVar9 = (this->_CmdHeader).ClipRect.w;
  (pIVar13->ClipRect).x = (this->_CmdHeader).ClipRect.x;
  (pIVar13->ClipRect).y = fVar7;
  pIVar11[(long)iVar10 + -1].ClipRect.z = fVar8;
  pIVar11[(long)iVar10 + -1].ClipRect.w = fVar9;
  return;
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}